

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_strcasecmp(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  sxi32 sVar1;
  char *zLeft;
  char *zRight;
  jx9_value *pObj;
  anon_union_8_3_18420de5_for_x aVar2;
  int n2;
  int n1;
  sxu32 local_30;
  sxu32 local_2c;
  
  if (nArg < 2) {
    aVar2.iVal._1_7_ = 0;
    aVar2.iVal._0_1_ = nArg != 0;
    pObj = pCtx->pRet;
    jx9MemObjRelease(pObj);
    pObj->x = aVar2;
  }
  else {
    zLeft = jx9_value_to_string(*apArg,(int *)&local_2c);
    zRight = jx9_value_to_string(apArg[1],(int *)&local_30);
    if ((int)local_30 < (int)local_2c) {
      local_30 = local_2c;
    }
    sVar1 = SyStrnicmp(zLeft,zRight,local_30);
    pObj = pCtx->pRet;
    jx9MemObjRelease(pObj);
    pObj->x = (anon_union_8_3_18420de5_for_x)(long)sVar1;
  }
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 2;
  return 0;
}

Assistant:

static int jx9Builtin_strcasecmp(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *z1, *z2;
	int n1, n2;
	int res;
	if( nArg < 2 ){
		res = nArg == 0 ? 0 : 1;
		jx9_result_int(pCtx, res);
		return JX9_OK;
	}
	/* Perform the comparison */
	z1 = jx9_value_to_string(apArg[0], &n1);
	z2 = jx9_value_to_string(apArg[1], &n2);
	res = SyStrnicmp(z1, z2, (sxu32)(SXMAX(n1, n2)));
	/* Comparison result */
	jx9_result_int(pCtx, res);
	return JX9_OK;
}